

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O1

double __thiscall HMatrix::compute_dot(HMatrix *this,HVector *vector,int iCol)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  long lVar4;
  double dVar5;
  
  if (iCol < this->numCol) {
    piVar3 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar3[iCol];
    lVar4 = (long)iVar1;
    iVar2 = piVar3[(long)iCol + 1];
    dVar5 = 0.0;
    if (iVar1 < iVar2) {
      do {
        dVar5 = dVar5 + (vector->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar4]] *
                        (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4];
        lVar4 = lVar4 + 1;
      } while (iVar2 != lVar4);
    }
    return dVar5;
  }
  return (vector->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[iCol - this->numCol];
}

Assistant:

double HMatrix::compute_dot(HVector& vector, int iCol) const {
    double result = 0;
    if (iCol < numCol) {
        for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++)
            result += vector.array[Aindex[k]] * Avalue[k];
    } else {
        result = vector.array[iCol - numCol];
    }
    return result;
}